

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O2

Exception *
capnp::_::anon_unknown_18::toException(Exception *__return_storage_ptr__,Reader *exception)

{
  ArrayPtr<const_unsigned_char> content;
  bool bVar1;
  Type type;
  DetailTypeId typeId;
  String reason;
  Reader detail;
  Array<char> local_e8;
  Array<char> *__return_storage_ptr___00;
  uint uVar2;
  undefined4 in_stack_ffffffffffffff3c;
  Array<char> local_c0;
  uint local_a8;
  ArrayPtr<const_char> local_90;
  DetailTypeId *local_80;
  uint local_70;
  Array<unsigned_char> local_60;
  Array<char> local_48;
  
  local_c0._0_16_ = rpc::Exception::Reader::getReason(exception);
  local_90.size_ = 0x13;
  local_90.ptr = "remote exception: ";
  bVar1 = kj::StringPtr::startsWith((StringPtr *)&local_c0,(StringPtr *)&local_90);
  if (bVar1) {
    local_c0._0_16_ = rpc::Exception::Reader::getReason(exception);
    kj::str<capnp::Text::Reader>((String *)&local_e8,(kj *)&local_c0,local_c0.size_);
  }
  else {
    local_c0._0_16_ = rpc::Exception::Reader::getReason(exception);
    kj::str<char_const(&)[19],capnp::Text::Reader>
              ((String *)&local_e8,(kj *)"remote exception: ",(char (*) [19])&local_c0,
               (Reader *)&local_c0);
  }
  type = FAILED;
  if (0x2f < (exception->_reader).dataSize) {
    type = (Type)*(ushort *)((long)(exception->_reader).data + 4);
  }
  local_48.ptr = local_e8.ptr;
  local_48.size_ = local_e8.size_;
  local_48.disposer = local_e8.disposer;
  local_e8.ptr = (char *)0x0;
  local_e8.size_ = 0;
  kj::Exception::Exception(__return_storage_ptr__,type,"(remote)",0,(String *)&local_48);
  kj::Array<char>::~Array(&local_48);
  bVar1 = rpc::Exception::Reader::hasTrace(exception);
  if (bVar1) {
    local_90 = (ArrayPtr<const_char>)rpc::Exception::Reader::getTrace(exception);
    kj::str<capnp::Text::Reader>((String *)&local_c0,(kj *)&local_90,(Reader *)local_90.size_);
    kj::Array<char>::operator=(&(__return_storage_ptr__->remoteTrace).content,&local_c0);
    kj::Array<char>::~Array(&local_c0);
  }
  __return_storage_ptr___00 = &local_c0;
  rpc::Exception::Reader::getDetails((Reader *)__return_storage_ptr___00,exception);
  for (uVar2 = 0; uVar2 != local_a8; uVar2 = uVar2 + 1) {
    IndexingIterator<const_capnp::List<capnp::rpc::Exception::Detail,_(capnp::Kind)3>::Reader,_capnp::rpc::Exception::Detail::Reader>
    ::operator*((Reader *)&local_90,
                (IndexingIterator<const_capnp::List<capnp::rpc::Exception::Detail,_(capnp::Kind)3>::Reader,_capnp::rpc::Exception::Detail::Reader>
                 *)&stack0xffffffffffffff30);
    bVar1 = rpc::Exception::Detail::Reader::hasData((Reader *)&local_90);
    if (bVar1) {
      if (local_70 < 0x40) {
        typeId = 0;
      }
      else {
        typeId = *local_80;
      }
      rpc::Exception::Detail::Reader::getData((Reader *)&local_90);
      content.size_._0_4_ = uVar2;
      content.ptr = (uchar *)__return_storage_ptr___00;
      content.size_._4_4_ = in_stack_ffffffffffffff3c;
      kj::heapArray<unsigned_char>(content);
      kj::Exception::setDetail(__return_storage_ptr__,typeId,&local_60);
      kj::Array<unsigned_char>::~Array(&local_60);
    }
  }
  kj::Array<char>::~Array(&local_e8);
  return __return_storage_ptr__;
}

Assistant:

kj::Exception toException(const rpc::Exception::Reader& exception) {
  auto reason = [&]() {
    if (exception.getReason().startsWith("remote exception: ")) {
      return kj::str(exception.getReason());
    } else {
      return kj::str("remote exception: ", exception.getReason());
    }
  }();

  kj::Exception result(static_cast<kj::Exception::Type>(exception.getType()),
      "(remote)", 0, kj::mv(reason));
  if (exception.hasTrace()) {
    result.setRemoteTrace(kj::str(exception.getTrace()));
  }
  for (auto detail : exception.getDetails()) {
    if (detail.hasData()) {
      result.setDetail(detail.getDetailId(), kj::heapArray(detail.getData()));
    }
  }
  return result;
}